

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

iterator * __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
::end(iterator *__return_storage_ptr__,
     IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
     *this)

{
  function<bool_(const_int_&)> *this_00;
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
  local_c0;
  
  local_c0.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_00158648;
  local_c0.source.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c0.source.source.source,&(this->source).source.source.source);
  local_c0.source.source.current._M_current = (this->source).source.source.current._M_current;
  local_c0.source.source.end._M_current = (this->source).source.source.end._M_current;
  this_00 = &local_c0.transformer;
  std::function<bool_(const_int_&)>::function(this_00,&(this->source).transformer);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree(&local_c0.result._M_t,&(this->source).result._M_t);
  local_c0.current._M_node = (this->source).current._M_node;
  iterator::iterator(__return_storage_ptr__,&local_c0,false);
  local_c0.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_00158648;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_c0.result._M_t);
  if (local_c0.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.transformer.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  local_c0.source.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if (local_c0.source.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.source.source.source.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.source.source.source.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.source.source.source.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }